

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int cmcmd::VisualStudioLinkIncremental
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,int type,bool verbose)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  allocator local_599;
  int mtRet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mtCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rcCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCommand;
  string manifestFile;
  string resourceInputFile;
  string tempManifest;
  string targetName;
  string outArg;
  string outputOpt;
  string manifestArg;
  string fullPath;
  string resourceFile;
  ofstream fout;
  
  linkCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linkCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
  targetName._M_string_length = 0;
  targetName.field_2._M_local_buf[0] = '\0';
  iVar2 = ParseVisualStudioLinkCommand(args,&linkCommand,&targetName);
  if (iVar2 == -1) {
    iVar2 = -1;
  }
  else {
    std::__cxx11::string::string((string *)&manifestArg,"/MANIFESTFILE:",(allocator *)&fout);
    rcCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rcCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rcCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    resourceFile._M_dataplus._M_p = (pointer)0x0;
    resourceFile._M_string_length = 0;
    resourceFile.field_2._M_allocated_capacity = 0;
    cmsys::SystemTools::FindProgram
              ((string *)&fout,"rc.exe",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&resourceFile,false);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rcCommand,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&resourceFile);
    mtCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    mtCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    mtCommand.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    resourceFile._M_dataplus._M_p = (pointer)0x0;
    resourceFile._M_string_length = 0;
    resourceFile.field_2._M_allocated_capacity = 0;
    cmsys::SystemTools::FindProgram
              ((string *)&fout,"mt.exe",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&resourceFile,false);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&mtCommand,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&resourceFile);
    tempManifest._M_dataplus._M_p = (pointer)&tempManifest.field_2;
    tempManifest._M_string_length = 0;
    tempManifest.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&tempManifest);
    std::__cxx11::string::append((char *)&tempManifest);
    std::__cxx11::string::string((string *)&resourceInputFile,(string *)&targetName);
    std::__cxx11::string::append((char *)&resourceInputFile);
    if (verbose) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Create ");
      poVar3 = std::operator<<(poVar3,(string *)&resourceInputFile);
      std::operator<<(poVar3,"\n");
    }
    std::ofstream::ofstream(&fout,resourceInputFile._M_dataplus._M_p,_S_out);
    if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5
        ) == 0) {
      std::__cxx11::string::string((string *)&manifestFile,(string *)&targetName);
      std::__cxx11::string::append((char *)&manifestFile);
      cmsys::SystemTools::CollapseFullPath(&fullPath,&manifestFile);
      poVar3 = (ostream *)std::ostream::operator<<(&fout,type);
      poVar3 = std::operator<<(poVar3,
                               " /* CREATEPROCESS_MANIFEST_RESOURCE_ID */ 24 /* RT_MANIFEST */ ");
      poVar3 = std::operator<<(poVar3,"\"");
      poVar3 = std::operator<<(poVar3,(string *)&fullPath);
      std::operator<<(poVar3,"\"");
      std::ofstream::close();
      std::__cxx11::string::append((string *)&manifestArg);
      std::__cxx11::string::string((string *)&resourceFile,"/MANIFEST",(allocator *)&outputOpt);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkCommand,
                 &resourceFile);
      std::__cxx11::string::~string((string *)&resourceFile);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&linkCommand,&manifestArg);
      bVar1 = cmsys::SystemTools::FileExists(manifestFile._M_dataplus._M_p);
      if (!bVar1) {
        if (verbose) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Create empty: ");
          poVar3 = std::operator<<(poVar3,(string *)&manifestFile);
          std::operator<<(poVar3,"\n");
        }
        std::ofstream::ofstream(&resourceFile,manifestFile._M_dataplus._M_p,_S_out);
        std::ofstream::~ofstream(&resourceFile);
      }
      std::__cxx11::string::string((string *)&resourceFile,(string *)&manifestFile);
      std::__cxx11::string::append((char *)&resourceFile);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&linkCommand,&resourceFile);
      std::__cxx11::string::string((string *)&outputOpt,"/fo",(allocator *)&outArg);
      std::__cxx11::string::append((string *)&outputOpt);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&rcCommand,&outputOpt);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&rcCommand,&resourceInputFile);
      bVar1 = RunCommand("RC Pass 1",&rcCommand,verbose,(int *)0x0);
      iVar2 = -1;
      if (bVar1) {
        bVar1 = RunCommand("LINK Pass 1",&linkCommand,verbose,(int *)0x0);
        if (bVar1) {
          std::__cxx11::string::string((string *)&outArg,"/out:",(allocator *)&mtRet);
          std::__cxx11::string::append((string *)&outArg);
          std::__cxx11::string::string((string *)&mtRet,"/nologo",&local_599);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&mtCommand
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mtRet);
          std::__cxx11::string::~string((string *)&mtRet);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&mtCommand,&outArg);
          std::__cxx11::string::string((string *)&mtRet,"/notify_update",&local_599);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&mtCommand
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mtRet);
          std::__cxx11::string::~string((string *)&mtRet);
          std::__cxx11::string::string((string *)&mtRet,"/manifest",&local_599);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&mtCommand
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mtRet);
          std::__cxx11::string::~string((string *)&mtRet);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&mtCommand,&tempManifest);
          mtRet = 0;
          RunCommand("MT",&mtCommand,verbose,&mtRet);
          if ((mtRet == 0xbb) || (iVar2 = mtRet, mtRet == 0x41020001)) {
            bVar1 = RunCommand("RC Pass 2",&rcCommand,verbose,(int *)0x0);
            if (bVar1) {
              bVar1 = RunCommand("FINAL LINK",&linkCommand,verbose,(int *)0x0);
              iVar2 = bVar1 - 1;
            }
            else {
              iVar2 = -1;
            }
          }
          std::__cxx11::string::~string((string *)&outArg);
        }
      }
      std::__cxx11::string::~string((string *)&outputOpt);
      std::__cxx11::string::~string((string *)&resourceFile);
      std::__cxx11::string::~string((string *)&fullPath);
      std::__cxx11::string::~string((string *)&manifestFile);
    }
    else {
      iVar2 = -1;
    }
    std::ofstream::~ofstream(&fout);
    std::__cxx11::string::~string((string *)&resourceInputFile);
    std::__cxx11::string::~string((string *)&tempManifest);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&mtCommand);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&rcCommand);
    std::__cxx11::string::~string((string *)&manifestArg);
  }
  std::__cxx11::string::~string((string *)&targetName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&linkCommand);
  return iVar2;
}

Assistant:

int cmcmd::VisualStudioLinkIncremental(std::vector<std::string>& args,
                                       int type, bool verbose)
{
  // This follows the steps listed here:
  // http://blogs.msdn.com/zakramer/archive/2006/05/22/603558.aspx

  //    1.  Compiler compiles the application and generates the *.obj files.
  //    2.  An empty manifest file is generated if this is a clean build and if
  //    not the previous one is reused.
  //    3.  The resource compiler (rc.exe) compiles the *.manifest file to a
  //    *.res file.
  //    4.  Linker generates the binary (EXE or DLL) with the /incremental
  //    switch and embeds the dummy manifest file. The linker also generates
  //    the real manifest file based on the binaries that your binary depends
  //    on.
  //    5.  The manifest tool (mt.exe) is then used to generate the final
  //    manifest.

  // If the final manifest is changed, then 6 and 7 are run, if not
  // they are skipped, and it is done.

  //    6.  The resource compiler is invoked one more time.
  //    7.  Finally, the Linker does another incremental link, but since the
  //    only thing that has changed is the *.res file that contains the
  //    manifest it is a short link.
  std::vector<std::string> linkCommand;
  std::string targetName;
  if(cmcmd::ParseVisualStudioLinkCommand(args, linkCommand, targetName) == -1)
    {
    return -1;
    }
  std::string manifestArg = "/MANIFESTFILE:";
  std::vector<std::string> rcCommand;
  rcCommand.push_back(cmSystemTools::FindProgram("rc.exe"));
  std::vector<std::string> mtCommand;
  mtCommand.push_back(cmSystemTools::FindProgram("mt.exe"));
  std::string tempManifest;
  tempManifest = targetName;
  tempManifest += ".intermediate.manifest";
  std::string resourceInputFile = targetName;
  resourceInputFile += ".resource.txt";
  if(verbose)
    {
    std::cout << "Create " << resourceInputFile << "\n";
    }
  // Create input file for rc command
  cmsys::ofstream fout(resourceInputFile.c_str());
  if(!fout)
    {
    return -1;
    }
  std::string manifestFile = targetName;
  manifestFile += ".embed.manifest";
  std::string fullPath= cmSystemTools::CollapseFullPath(manifestFile);
  fout << type << " /* CREATEPROCESS_MANIFEST_RESOURCE_ID "
    "*/ 24 /* RT_MANIFEST */ " << "\"" << fullPath << "\"";
  fout.close();
  manifestArg += tempManifest;
  // add the manifest arg to the linkCommand
  linkCommand.push_back("/MANIFEST");
  linkCommand.push_back(manifestArg);
  // if manifestFile is not yet created, create an
  // empty one
  if(!cmSystemTools::FileExists(manifestFile.c_str()))
    {
    if(verbose)
      {
      std::cout << "Create empty: " << manifestFile << "\n";
      }
    cmsys::ofstream foutTmp(manifestFile.c_str());
    }
  std::string resourceFile = manifestFile;
  resourceFile += ".res";
  // add the resource file to the end of the link command
  linkCommand.push_back(resourceFile);
  std::string outputOpt = "/fo";
  outputOpt += resourceFile;
  rcCommand.push_back(outputOpt);
  rcCommand.push_back(resourceInputFile);
  // Run rc command to create resource
  if(!cmcmd::RunCommand("RC Pass 1", rcCommand, verbose))
    {
    return -1;
    }
  // Now run the link command to link and create manifest
  if(!cmcmd::RunCommand("LINK Pass 1", linkCommand, verbose))
    {
    return -1;
    }
  // create mt command
  std::string outArg("/out:");
  outArg+= manifestFile;
  mtCommand.push_back("/nologo");
  mtCommand.push_back(outArg);
  mtCommand.push_back("/notify_update");
  mtCommand.push_back("/manifest");
  mtCommand.push_back(tempManifest);
  //  now run mt.exe to create the final manifest file
  int mtRet =0;
  cmcmd::RunCommand("MT", mtCommand, verbose, &mtRet);
  // if mt returns 0, then the manifest was not changed and
  // we do not need to do another link step
  if(mtRet == 0)
    {
    return 0;
    }
  // check for magic mt return value if mt returns the magic number
  // 1090650113 then it means that it updated the manifest file and we need
  // to do the final link.  If mt has any value other than 0 or 1090650113
  // then there was some problem with the command itself and there was an
  // error so return the error code back out of cmake so make can report it.
  // (when hosted on a posix system the value is 187)
  if(mtRet != 1090650113 && mtRet != 187)
    {
    return mtRet;
    }
  // update the resource file with the new manifest from the mt command.
  if(!cmcmd::RunCommand("RC Pass 2", rcCommand, verbose))
    {
    return -1;
    }
  // Run the final incremental link that will put the new manifest resource
  // into the file incrementally.
  if(!cmcmd::RunCommand("FINAL LINK", linkCommand, verbose))
    {
    return -1;
    }
  return 0;
}